

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O2

void nsync::nsync_mu_unlock_slow_(nsync_mu *mu,lock_type *l_type)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  __int_type _Var5;
  nsync_dll_element_ *pnVar6;
  nsync_dll_element_ *pnVar7;
  code *pcVar8;
  nsync_dll_list_ list;
  void *pvVar9;
  uint uVar10;
  undefined *puVar11;
  bool bVar12;
  uint local_5c;
  nsync_dll_list_ local_58;
  nsync_dll_list_ local_48;
  
  uVar2 = 0;
  do {
    uVar1 = (mu->word).super___atomic_base<unsigned_int>._M_i;
    if ((((~uVar1 & 0x180) == 0) || ((uVar1 & 0xc) != 4)) || (0x100 < (uVar1 & 0xffffff00))) {
      LOCK();
      bVar12 = uVar1 == (mu->word).super___atomic_base<unsigned_int>._M_i;
      if (bVar12) {
        (mu->word).super___atomic_base<unsigned_int>._M_i =
             ~l_type->clear_on_uncontended_release & uVar1 - l_type->add_to_acquire;
      }
      UNLOCK();
      if (bVar12) {
        return;
      }
    }
    else if ((uVar1 & 2) == 0) {
      uVar10 = (uVar1 & 0x10) >> 4;
      LOCK();
      bVar12 = uVar1 == (mu->word).super___atomic_base<unsigned_int>._M_i;
      if (bVar12) {
        (mu->word).super___atomic_base<unsigned_int>._M_i =
             (uVar1 - l_type->add_to_acquire) + uVar10 | 10;
      }
      UNLOCK();
      if (bVar12) break;
    }
    uVar2 = nsync_spin_delay_(uVar2);
  } while( true );
  local_5c = 0x80;
  local_58 = (nsync_dll_list_)0x0;
  puVar11 = (undefined *)0x0;
  local_48 = (nsync_dll_list_)0x0;
  do {
    list = mu->waiters;
    mu->waiters = (nsync_dll_element_s_ *)0x0;
    iVar3 = nsync_dll_is_empty_(list);
    if (iVar3 != 0) {
      mu->waiters = local_48;
      iVar3 = nsync_dll_is_empty_(local_58);
      iVar4 = nsync_dll_is_empty_(mu->waiters);
      uVar2 = (uint)(iVar3 != 0) * 8 + 0xb6;
      if (iVar4 == 0) {
        uVar2 = (local_5c & 0x80) + (uint)(iVar3 != 0) * 8 + 2 ^ 0x80;
      }
      _Var5 = (mu->word).super___atomic_base<unsigned_int>._M_i;
      while( true ) {
        LOCK();
        bVar12 = _Var5 == (mu->word).super___atomic_base<unsigned_int>._M_i;
        if (bVar12) {
          (mu->word).super___atomic_base<unsigned_int>._M_i =
               (_Var5 + ((int)((uVar1 & 0x10) << 0x1b) >> 0x1f) | local_5c) & ~uVar2;
        }
        UNLOCK();
        if (bVar12) break;
        _Var5 = (mu->word).super___atomic_base<unsigned_int>._M_i;
      }
      pnVar6 = nsync_dll_first_(local_58);
      while (pnVar6 != (nsync_dll_element_ *)0x0) {
        pnVar7 = nsync_dll_next_(local_58,pnVar6);
        local_58 = nsync_dll_remove_(local_58,pnVar6);
        *(undefined4 *)((long)pnVar6->container + 0x20) = 0;
        nsync_mu_semaphore_v((nsync_semaphore *)((long)pnVar6->container + -0x100));
        pnVar6 = pnVar7;
      }
      return;
    }
    pnVar6 = nsync_dll_first_(list);
    if (uVar10 == 0) {
LAB_00105a0a:
      uVar10 = 0;
      bVar12 = false;
    }
    else {
      bVar12 = false;
      uVar10 = 0;
      if (puVar11 != nsync_writer_type_) {
        if (((puVar11 == (undefined *)0x0) &&
            (*(undefined **)((long)pnVar6->container + 0x40) != nsync_reader_type_)) &&
           (*(long *)((long)pnVar6->container + 0x50) == 0)) goto LAB_00105a0a;
        mu_release_spinlock(mu);
        bVar12 = true;
        uVar10 = 1;
      }
    }
    while ((pnVar6 != (nsync_dll_element_ *)0x0 && (puVar11 != nsync_writer_type_))) {
      pnVar7 = nsync_dll_next_(list,pnVar6);
      pvVar9 = pnVar6->container;
      pcVar8 = *(code **)((long)pvVar9 + 0x50);
      if (pcVar8 == (code *)0x0 || bVar12) {
        if (pcVar8 != (code *)0x0) goto LAB_00105a60;
LAB_00105a9c:
        if ((puVar11 == (undefined *)0x0) ||
           (*(undefined **)((long)pnVar6->container + 0x40) == nsync_reader_type_)) {
          list = nsync_remove_from_mu_queue_(list,pnVar6);
          local_58 = nsync_dll_make_last_in_list_(local_58,pnVar6);
          puVar11 = *(undefined **)((long)pnVar6->container + 0x40);
          pnVar6 = pnVar7;
        }
        else {
          local_5c = 0x20;
          pnVar6 = pnVar7;
        }
      }
      else {
        nsync_panic_("checking a waiter condition while unlocked\n");
        pvVar9 = pnVar6->container;
        pcVar8 = *(code **)((long)pvVar9 + 0x50);
LAB_00105a60:
        iVar3 = (*pcVar8)(*(undefined8 *)((long)pvVar9 + 0x58));
        if (iVar3 != 0) goto LAB_00105a9c;
        pnVar7 = (nsync_dll_element_ *)
                 (*(long *)(*(long *)((long)pnVar6->container + 0x70) + 0x10) + 0x110);
        if ((pnVar7 == pnVar6) || (pnVar7 == pnVar6->prev)) {
          pnVar7 = pnVar6;
        }
        pnVar6 = nsync_dll_next_(list,pnVar7);
      }
    }
    if (pnVar6 != (nsync_dll_element_ *)0x0) {
      local_5c = local_5c & 0xffffff7f;
    }
    if (bVar12) {
      nsync_spin_test_and_set_(&mu->word,2,2,0);
    }
    pnVar6 = nsync_dll_last_(local_48);
    pnVar7 = nsync_dll_first_(list);
    nsync_maybe_merge_conditions_(pnVar6,pnVar7);
    pnVar6 = nsync_dll_last_(list);
    local_48 = nsync_dll_make_last_in_list_(local_48,pnVar6);
  } while( true );
}

Assistant:

void nsync_mu_unlock_slow_ (nsync_mu *mu, lock_type *l_type) {
	unsigned attempts = 0; /* attempt count; used for backoff */
	for (;;) {
		uint32_t old_word = ATM_LOAD (&mu->word);
		int testing_conditions = ((old_word & MU_CONDITION) != 0);
		uint32_t early_release_mu = l_type->add_to_acquire;
		uint32_t late_release_mu = 0;
		if (testing_conditions) {
			/* Convert to a writer lock, and release later.
			   - A writer lock is currently needed to test conditions
			     because exclusive access is needed to the list to
			     allow modification.  The spinlock cannot be used
			     to achieve that, because an internal lock should not
			     be held when calling the external predicates.
			   - We must test conditions even though a reader region
			     cannot have made any new ones true because some
			     might have been true before the reader region started.
			     The MU_ALL_FALSE test below shortcuts the case where
			     the conditions are known all to be false.  */
			early_release_mu = l_type->add_to_acquire - MU_WLOCK;
			late_release_mu = MU_WLOCK;
		}
		if ((old_word&MU_WAITING) == 0 || (old_word&MU_DESIG_WAKER) != 0 ||
		    (old_word & MU_RLOCK_FIELD) > MU_RLOCK ||
		    (old_word & (MU_RLOCK|MU_ALL_FALSE)) == (MU_RLOCK|MU_ALL_FALSE)) {
			/* no one to wake, there's a designated waker waking
			   up, there are still readers, or it's a reader and all waiters
			   have false conditions */
			if (ATM_CAS_REL (&mu->word, old_word,
					 (old_word - l_type->add_to_acquire) &
					 ~l_type->clear_on_uncontended_release)) {
				return;
			}
		} else if ((old_word&MU_SPINLOCK) == 0 &&
			   ATM_CAS_RELACQ (&mu->word, old_word,
                                           (old_word-early_release_mu)|MU_SPINLOCK|MU_DESIG_WAKER)) {
			nsync_dll_list_ wake;
			lock_type *wake_type;
			uint32_t clear_on_release;
			uint32_t set_on_release;
			/* The spinlock is now held, and we've set the
			   designated wake flag, since we're likely to wake a
			   thread that will become that designated waker.  If
			   there are conditions to check, the mutex itself is
			   still held.  */

			nsync_dll_element_ *p = NULL;
			nsync_dll_element_ *next = NULL;

			/* Swap the entire mu->waiters list into the local
			   "new_waiters" list.  This gives us exclusive access
			   to the list, even if we unlock the spinlock, which
			   we may do if checking conditions.  The loop below
			   will grab more new waiters that arrived while we
			   were checking conditions, and terminates only if no
			   new waiters arrive in one loop iteration.  */
			nsync_dll_list_ waiters = NULL;
			nsync_dll_list_ new_waiters = mu->waiters;
			mu->waiters = NULL;

			/* Remove a waiter from the queue, if possible. */
			wake = NULL;       /* waiters to wake. */
			wake_type = NULL; /* type of waiter(s) on wake, or NULL if wake is empty. */
			clear_on_release = MU_SPINLOCK;
			set_on_release = MU_ALL_FALSE;
			while (!nsync_dll_is_empty_ (new_waiters)) { /* some new waiters to consider */
				p = nsync_dll_first_ (new_waiters);
				if (testing_conditions) {
					/* Should we continue to test conditions? */
					if (wake_type == nsync_writer_type_) {
						/* No, because we're already waking a writer,
						   and need wake no others.*/
						testing_conditions = 0;
					} else if (wake_type == NULL &&
						DLL_WAITER (p)->l_type != nsync_reader_type_ &&
						DLL_WAITER (p)->cond.f == NULL) {
						/* No, because we've woken no one, but the
						   first waiter is a writer with no condition,
						   so we will certainly wake it, and need wake
						   no others. */
						testing_conditions = 0;
					}
				}
				/* If testing waiters' conditions, release the
				   spinlock while still holding the write lock.
				   This is so that the spinlock is not held
				   while the conditions are evaluated.  */
				if (testing_conditions) {
					mu_release_spinlock (mu);
				}

				/* Process the new waiters picked up in this iteration of the
				   "while (!nsync_dll_is_empty_ (new_waiters))" loop,
				   and stop looking when we run out of waiters, or we find
				   a writer to wake up. */
				while (p != NULL && wake_type != nsync_writer_type_) {
					int p_has_condition;
					next = nsync_dll_next_ (new_waiters, p);
					p_has_condition = (DLL_WAITER (p)->cond.f != NULL);
					if (p_has_condition && !testing_conditions) {
						nsync_panic_ ("checking a waiter condition "
							      "while unlocked\n");
					}
					if (p_has_condition && !condition_true (p)) {
						/* condition is false */
						/* skip to the end of the same_condition group. */
						next = skip_past_same_condition (new_waiters, p);
					} else if (wake_type == NULL ||
						   DLL_WAITER (p)->l_type == nsync_reader_type_) {
						/* Wake this thread. */
						new_waiters = nsync_remove_from_mu_queue_ (
							new_waiters, p);
						wake = nsync_dll_make_last_in_list_ (wake, p);
						wake_type = DLL_WAITER (p)->l_type;
					} else {
						/* Failing to wake a writer
						   that could acquire if it
						   were first.  */
						set_on_release |= MU_WRITER_WAITING;
						set_on_release &= ~MU_ALL_FALSE;
					}
					p = next;
				}

				if (p != NULL) {
					/* Didn't search to end of list, so can't be sure
					   all conditions are false. */
					set_on_release &= ~MU_ALL_FALSE;
				}

				/* If testing waiters' conditions, reacquire the spinlock
				   released above. */
				if (testing_conditions) {
					nsync_spin_test_and_set_ (&mu->word, MU_SPINLOCK,
								  MU_SPINLOCK, 0);
				}

				/* add the new_waiters to the last of the waiters. */
				nsync_maybe_merge_conditions_ (nsync_dll_last_ (waiters),
							       nsync_dll_first_ (new_waiters));
				waiters = nsync_dll_make_last_in_list_ (waiters,
								 nsync_dll_last_ (new_waiters));
				/* Pick up the next set of new waiters. */
				new_waiters = mu->waiters;
				mu->waiters = NULL;
			}

			/* Return the local waiter list to *mu. */
			mu->waiters = waiters;

			if (nsync_dll_is_empty_ (wake)) {
				/* not waking a waiter => no designated waker */
				clear_on_release |= MU_DESIG_WAKER;
			}

			if ((set_on_release & MU_ALL_FALSE) == 0) {
				/* If not explicitly setting MU_ALL_FALSE, clear it. */
				clear_on_release |= MU_ALL_FALSE;
			}

			if (nsync_dll_is_empty_ (mu->waiters)) {
				/* no waiters left */
				clear_on_release |= MU_WAITING | MU_WRITER_WAITING |
						    MU_CONDITION | MU_ALL_FALSE;
			}

			/* Release the spinlock, and possibly the lock if
			   late_release_mu is non-zero.  Other bits are set or
			   cleared according to whether we woke any threads,
			   whether any waiters remain, and whether any of them
			   are writers.  */
			old_word = ATM_LOAD (&mu->word);
			while (!ATM_CAS_REL (&mu->word, old_word,
					     ((old_word-late_release_mu)|set_on_release) &
					     ~clear_on_release)) { /* release CAS */
				old_word = ATM_LOAD (&mu->word);
			}
			/* Wake the waiters. */
			for (p = nsync_dll_first_ (wake); p != NULL; p = next) {
				next = nsync_dll_next_ (wake, p);
				wake = nsync_dll_remove_ (wake, p);
				ATM_STORE_REL (&DLL_NSYNC_WAITER (p)->waiting, 0);
				nsync_mu_semaphore_v (&DLL_WAITER (p)->sem);
			}
			return;
		}
		attempts = nsync_spin_delay_ (attempts);
	}
}